

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O1

void __thiscall sock_tests::wait::test_method(wait *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 local_11c;
  ssize_t local_118;
  lazy_ostream local_110;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  thread waiter;
  undefined4 *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined1 *local_b0;
  undefined4 **local_a8;
  ssize_t *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  ssize_t **local_80;
  char *local_78;
  char *local_70;
  assertion_result local_68;
  Sock sock1;
  Sock sock0;
  int s [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateSocketPair(s);
  Sock::Sock(&sock0,s[0]);
  Sock::Sock(&sock1,s[1]);
  waiter._M_id._M_thread = (id)0;
  local_98 = (undefined **)operator_new(0x10);
  *local_98 = (undefined *)&PTR___State_013d8698;
  local_98[1] = (undefined *)&sock0;
  std::thread::_M_start_thread(&waiter,&local_98,0);
  if (local_98 != (undefined **)0x0) {
    (**(code **)(*local_98 + 8))();
  }
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8a;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_118 = Sock::Send(&sock1,"a",1,0);
  local_a0 = &local_118;
  local_c8 = &local_11c;
  local_11c = 1;
  local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118 == 1);
  local_68.m_message.px = (element_type *)0x0;
  local_68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_70 = "";
  local_80 = &local_a0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d4050;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_c8;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_013d3e70;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_68,&local_110,2,2,REQUIRE,0xf6a8c6,(size_t)&local_78,0x8a,&local_98,"1",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_68.m_message.pn);
  std::thread::join();
  if (waiter._M_id._M_thread == 0) {
    Sock::~Sock(&sock1);
    Sock::~Sock(&sock0);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(wait)
{
    int s[2];
    CreateSocketPair(s);

    Sock sock0(s[0]);
    Sock sock1(s[1]);

    std::thread waiter([&sock0]() { (void)sock0.Wait(24h, Sock::RECV); });

    BOOST_REQUIRE_EQUAL(sock1.Send("a", 1, 0), 1);

    waiter.join();
}